

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall
Search::predictor::make_new_pointer<float>(predictor *this,v_array<float> *A,size_t new_size)

{
  float *__src;
  float *pfVar1;
  float *__dest;
  
  __src = A->_begin;
  pfVar1 = A->_end;
  __dest = calloc_or_throw<float>(new_size);
  A->_begin = __dest;
  A->_end = __dest + new_size;
  A->end_array = __dest + new_size;
  memcpy(__dest,__src,(long)pfVar1 - (long)__src);
  return;
}

Assistant:

void predictor::make_new_pointer(v_array<T>& A, size_t new_size)
{
  size_t old_size = A.size();
  T* old_pointer = A.begin();
  A.begin() = calloc_or_throw<T>(new_size);
  A.end() = A.begin() + new_size;
  A.end_array = A.end();
  memcpy(A.begin(), old_pointer, old_size * sizeof(T));
}